

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  uint uVar2;
  u8 *puVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  undefined6 in_register_00000012;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  undefined6 in_register_00000032;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  ushort uVar15;
  uint uVar16;
  ulong uVar17;
  
  uVar9 = CONCAT62(in_register_00000032,iStart);
  uVar17 = CONCAT62(in_register_00000012,iSize) & 0xffffffff;
  uVar10 = (uint)uVar9;
  uVar7 = (int)CONCAT62(in_register_00000012,iSize) + uVar10;
  puVar3 = pPage->aData;
  uVar6 = (ulong)pPage->hdrOffset;
  uVar1 = uVar6 + 1;
  uVar4 = uVar1;
  uVar8 = uVar17;
  if ((puVar3[uVar6 + 2] == '\0') && (puVar3[uVar1] == '\0')) {
    uVar11 = 0;
    uVar12 = uVar1;
  }
  else {
    do {
      uVar12 = uVar4;
      uVar15 = *(ushort *)(puVar3 + uVar12);
      uVar11 = uVar15 << 8 | uVar15 >> 8;
      uVar16 = (uint)uVar11;
      uVar13 = (uint)uVar12;
      if (iStart <= uVar11) goto LAB_00132ec0;
      uVar4 = (ulong)uVar11;
    } while (uVar13 + 4 <= uVar16);
    if (uVar11 != 0) {
      iVar5 = 0xfc7d;
      goto LAB_00133049;
    }
LAB_00132ec0:
    uVar2 = pPage->pBt->usableSize;
    if (uVar2 - 4 < uVar16) {
      iVar5 = 0xfc82;
      goto LAB_00133049;
    }
    if (uVar7 + 3 < uVar16 || uVar11 == 0) {
      bVar14 = 0;
    }
    else {
      bVar14 = (char)(uVar15 >> 8) - (char)uVar7;
      if (uVar11 < uVar7) {
        iVar5 = 0xfc8e;
        goto LAB_00133049;
      }
      uVar7 = (ushort)(*(ushort *)(puVar3 + (ulong)uVar11 + 2) << 8 |
                      *(ushort *)(puVar3 + (ulong)uVar11 + 2) >> 8) + uVar16;
      if (uVar2 < uVar7) {
        iVar5 = 0xfc91;
        goto LAB_00133049;
      }
      uVar8 = (ulong)(uVar7 - uVar10);
      uVar11 = *(ushort *)(puVar3 + uVar11) << 8 | *(ushort *)(puVar3 + uVar11) >> 8;
    }
    if (((uint)uVar1 < uVar13) &&
       (uVar15 = *(ushort *)(puVar3 + uVar12 + 2) << 8 | *(ushort *)(puVar3 + uVar12 + 2) >> 8,
       uVar10 <= uVar15 + uVar13 + 3)) {
      uVar16 = uVar15 + uVar13;
      if (uVar10 < uVar16) {
        iVar5 = 0xfc9e;
        goto LAB_00133049;
      }
      bVar14 = bVar14 + ((char)iStart - (char)uVar16);
      uVar8 = (ulong)(uVar7 - uVar13);
      uVar9 = uVar12;
    }
    if (puVar3[uVar6 + 7] < bVar14) {
      iVar5 = 0xfca4;
      goto LAB_00133049;
    }
    puVar3[uVar6 + 7] = puVar3[uVar6 + 7] - bVar14;
    uVar10 = (uint)uVar9 & 0xffff;
  }
  uVar13 = (uint)(ushort)(*(ushort *)(puVar3 + uVar6 + 5) << 8 |
                         *(ushort *)(puVar3 + uVar6 + 5) >> 8);
  if (uVar13 < uVar10) {
    *(ushort *)(puVar3 + uVar12) = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
  }
  else {
    if ((uVar10 < uVar13) || ((uint)uVar1 != (uint)uVar12)) {
      iVar5 = 0xfcac;
LAB_00133049:
      iVar5 = sqlite3CorruptError(iVar5);
      return iVar5;
    }
    *(ushort *)(puVar3 + uVar1) = uVar11 << 8 | uVar11 >> 8;
    puVar3[uVar6 + 5] = (u8)(uVar7 >> 8);
    puVar3[uVar6 + 6] = (u8)uVar7;
  }
  uVar9 = uVar9 & 0xffff;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar3 + uVar9,0,uVar8 & 0xffff);
  }
  puVar3[uVar9] = (u8)(uVar11 >> 8);
  puVar3[uVar9 + 1] = (u8)uVar11;
  puVar3[uVar9 + 2] = (u8)(uVar8 >> 8);
  puVar3[uVar9 + 3] = (u8)uVar8;
  pPage->nFree = pPage->nFree + (short)uVar17;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the 
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break;
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 );
  
    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }
  
    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  x = get2byte(&data[hdr+5]);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x || iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}